

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Result wabt::interp::Match(GlobalType *expected,GlobalType *actual,string *out_msg)

{
  ValueType in_stack_ffffffffffffff78;
  undefined8 local_68;
  undefined8 local_48;
  
  if (actual->mut == expected->mut) {
    if (*(long *)&(actual->super_ExternType).field_0xc ==
        *(long *)&(expected->super_ExternType).field_0xc) {
      return (Result)Ok;
    }
    GetName_abi_cxx11_(in_stack_ffffffffffffff78);
    GetName_abi_cxx11_(in_stack_ffffffffffffff78);
    StringPrintf_abi_cxx11_
              ((string *)&stack0xffffffffffffff78,
               "type mismatch in imported global, expected %s but got %s.",local_48,local_68);
    std::__cxx11::string::operator=((string *)out_msg,(string *)&stack0xffffffffffffff78);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  else {
    StringPrintf_abi_cxx11_
              ((string *)&stack0xffffffffffffff78,
               "mutability mismatch in imported global, expected %s but got %s.",
               GetName::kNames[(int)actual->mut],GetName::kNames[(int)expected->mut]);
    std::__cxx11::string::operator=((string *)out_msg,(string *)&stack0xffffffffffffff78);
  }
  std::__cxx11::string::_M_dispose();
  return (Result)Error;
}

Assistant:

Result Match(const GlobalType& expected,
             const GlobalType& actual,
             std::string* out_msg) {
  if (actual.mut != expected.mut) {
    *out_msg = StringPrintf(
        "mutability mismatch in imported global, expected %s but got %s.",
        GetName(actual.mut), GetName(expected.mut));
    return Result::Error;
  }

  if (actual.type != expected.type &&
      (expected.mut == Mutability::Var ||
       !TypesMatch(expected.type, actual.type))) {
    *out_msg = StringPrintf(
        "type mismatch in imported global, expected %s but got %s.",
        GetName(expected.type).c_str(), GetName(actual.type).c_str());
    return Result::Error;
  }

  return Result::Ok;
}